

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

void __thiscall dtc::text_input_buffer::skip_spaces(text_input_buffer *this)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  _Elt_pointer psVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  
  bVar1 = finished(this);
  if (!bVar1) {
    do {
      psVar4 = (this->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar4 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00133135:
        bVar7 = 0;
        bVar1 = false;
      }
      else {
        if (psVar4 == (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar4 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar3 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        uVar6 = peVar3->cursor;
        bVar7 = false;
        if ((int)uVar6 < 0) goto LAB_00133135;
        bVar1 = false;
        bVar2 = (bool)bVar7;
        if ((int)uVar6 < peVar3->size) goto LAB_00133125;
      }
      while ((bVar7 - 9 < 5 || (bVar7 == 0x20))) {
        psVar4 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar4 != (this->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          this->cursor = this->cursor + 1;
          if (psVar4 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar5 = peVar3->cursor + 1;
          peVar3->cursor = iVar5;
          if (peVar3->size <= iVar5) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&(this->input_stack).c);
          }
        }
        bVar1 = bVar7 == 10 || bVar7 == 0xd;
        bVar2 = finished(this);
        bVar7 = 0;
        if (!bVar2) {
          psVar4 = (this->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          bVar7 = 0;
          if (psVar4 != (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            if (psVar4 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar4 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar6 = peVar3->cursor;
            bVar7 = 0;
            if ((-1 < (int)uVar6) && (bVar2 = bVar1, (int)uVar6 < peVar3->size)) {
LAB_00133125:
              bVar1 = bVar2;
              bVar7 = peVar3->buffer[uVar6];
            }
          }
        }
      }
      if ((bVar7 == 0x23) && ((~bVar1 & this->cursor != 0) == 0)) {
        skip_to(this,'\n');
        skip_spaces(this);
      }
      bVar1 = consume(this,"/include/");
      if (!bVar1) {
        return;
      }
      handle_include(this);
      bVar1 = finished(this);
    } while (!bVar1);
  }
  return;
}

Assistant:

void
text_input_buffer::skip_spaces()
{
	if (finished()) { return; }
	char c = *(*this);
	bool last_nl = false;
	while ((c == ' ') || (c == '\t') || (c == '\n') || (c == '\f')
	       || (c == '\v') || (c == '\r'))
	{
		last_nl = ((c == '\n') || (c == '\r'));
		++(*this);
		if (finished())
		{
			c = '\0';
		}
		else
		{
			c = *(*this);
		}
	}
	// Skip C preprocessor leftovers
	if ((c == '#') && ((cursor == 0) || last_nl))
	{
		skip_to('\n');
		skip_spaces();
	}
	if (consume("/include/"))
	{
		handle_include();
		skip_spaces();
	}
}